

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::EventDelayStmt::EventDelayStmt(EventDelayStmt *this,EventControl event)

{
  _Rb_tree_header *p_Var1;
  uint64_t in_stack_00000008;
  
  (this->super_AuxiliaryStmt).super_Stmt.super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_AuxiliaryStmt).super_Stmt.super_enable_shared_from_this<kratos::Stmt>._M_weak_this.
  super___weak_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.fn_name_ln.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(undefined8 *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data + 0xc) = 0;
  *(undefined8 *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.fn_name_ln.
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
           ._M_impl.super__Vector_impl_data + 0x14) = 0;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.comment._M_dataplus._M_p =
       (pointer)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.comment.field_2;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.comment._M_string_length = 0;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.comment.field_2._M_local_buf[0] = '\0';
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.ast_node_type_ = StmtKind;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode.attributes_.
  super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data + 8) = (pointer)0x0;
  *(pointer *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.super_IRNode.attributes_.
           super__Vector_base<std::shared_ptr<kratos::Attribute>,_std::allocator<std::shared_ptr<kratos::Attribute>_>_>
           ._M_impl.super__Vector_impl_data + 0x10) = (pointer)0x0;
  (this->super_AuxiliaryStmt).super_Stmt.type_ = Auxiliary;
  (this->super_AuxiliaryStmt).super_Stmt.parent_ = (IRNode *)0x0;
  (this->super_AuxiliaryStmt).super_Stmt.stmt_id_ = -1;
  p_Var1 = &(this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header
  ;
  (this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header._M_header
  ._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
           _M_header + 0x18) = p_Var1;
  (this->super_AuxiliaryStmt).super_Stmt.scope_context_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_AuxiliaryStmt).type_ = Delay;
  (this->super_AuxiliaryStmt).super_Stmt.super_IRNode._vptr_IRNode =
       (_func_int **)&PTR_accept_002a7d00;
  *(Var **)&(this->event_).type = event.var;
  (this->event_).delay_side = event.type;
  *(EventEdgeType *)&(this->event_).field_0x1c = event.edge;
  (this->event_).delay = in_stack_00000008;
  (this->event_).var = (Var *)event.delay;
  return;
}

Assistant:

EventDelayStmt::EventDelayStmt(kratos::EventControl event)
    : AuxiliaryStmt(AuxiliaryType::Delay), event_(event) {}